

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O1

bool __thiscall slang::ast::SubroutineSymbol::hasOutputArgs(SubroutineSymbol *this)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  
  if ((this->cachedHasOutputArgs).super__Optional_base<bool,_true,_true>._M_payload.
      super__Optional_payload_base<bool>._M_engaged == false) {
    (this->cachedHasOutputArgs).super__Optional_base<bool,_true,_true>._M_payload.
    super__Optional_payload_base<bool> = (_Optional_payload_base<bool>)0x100;
    if ((this->super_Scope).deferredMemberIndex != Invalid) {
      Scope::elaborate(&this->super_Scope);
    }
    sVar2 = (this->arguments)._M_extent._M_extent_value;
    if (sVar2 != 0) {
      lVar4 = 0;
      do {
        lVar3 = *(long *)((long)(this->arguments)._M_ptr + lVar4);
        iVar1 = *(int *)(lVar3 + 0x158);
        if ((iVar1 != 0) && ((iVar1 != 3 || ((*(byte *)(lVar3 + 0x154) & 1) == 0)))) {
          (this->cachedHasOutputArgs).super__Optional_base<bool,_true,_true>._M_payload.
          super__Optional_payload_base<bool> = (_Optional_payload_base<bool>)0x101;
          break;
        }
        lVar4 = lVar4 + 8;
      } while (sVar2 << 3 != lVar4);
    }
  }
  return (this->cachedHasOutputArgs).super__Optional_base<bool,_true,_true>._M_payload.
         super__Optional_payload_base<bool>._M_payload._M_value;
}

Assistant:

bool SubroutineSymbol::hasOutputArgs() const {
    if (!cachedHasOutputArgs.has_value()) {
        cachedHasOutputArgs = false;
        for (auto arg : getArguments()) {
            if (arg->direction != ArgumentDirection::In &&
                (arg->direction != ArgumentDirection::Ref ||
                 !arg->flags.has(VariableFlags::Const))) {
                cachedHasOutputArgs = true;
                break;
            }
        }
    }
    return *cachedHasOutputArgs;
}